

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::sanitize_append_path_element(aux *this,string *path,string_view element)

{
  long lVar1;
  int iVar2;
  long lVar3;
  pair<int,_int> pVar4;
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  char cVar10;
  char cVar11;
  size_t k;
  string *psVar12;
  int iVar13;
  string *__pos;
  int iVar14;
  uint uVar15;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  uint local_64;
  ulong local_60;
  string_view element_local;
  
  element_local._M_str = (char *)element._M_len;
  if ((path != (string *)0x1) || (*element_local._M_str != '.')) {
    element_local._M_len = (size_t)path;
    ::std::__cxx11::string::reserve((ulong)this);
    cVar10 = (char)this;
    if (*(long *)(this + 8) == 0) {
      lVar3 = 0;
    }
    else {
      ::std::__cxx11::string::push_back(cVar10);
      lVar3 = -1;
    }
    if (path == (string *)0x0) {
      ::std::__cxx11::string::append((char *)this);
      return;
    }
    cVar11 = '\0';
    local_60 = 0;
    iVar14 = 0;
    for (__pos = (string *)0x0; __pos < path;
        __pos = (string *)((long)&(__pos->_M_dataplus)._M_p + ((long)pVar4 >> 0x20))) {
      bVar16 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&element_local,(size_type)__pos,0xffffffffffffffff);
      str._M_str = bVar16._M_str;
      str._M_len = (size_t)str._M_str;
      pVar4 = parse_utf8_codepoint((aux *)bVar16._M_len,str);
      uVar15 = pVar4.first;
      if ((int)uVar15 < 0) {
LAB_0031830b:
        ::std::__cxx11::string::push_back(cVar10);
        iVar14 = iVar14 + 1;
      }
      else {
        local_64 = uVar15;
        piVar5 = ::std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (libtorrent::(anonymous_namespace)::filter_path_character(int)::bad_cp,
                            ".%d%s",&local_64);
        if ((piVar5 == (int *)".%d%s") &&
           ((0x7f < (int)local_64 ||
            ((((char)local_64 != '\0' && ((local_64 & 0xff) != 0x5c)) && ((local_64 & 0xff) != 0x2f)
             ))))) {
          if (uVar15 < 0x20) goto LAB_0031830b;
          uVar6 = (ulong)pVar4 >> 0x20;
          for (psVar12 = __pos;
              psVar12 < (string *)((long)&(__pos->_M_dataplus)._M_p + ((long)pVar4 >> 0x20));
              psVar12 = (string *)((long)&(psVar12->_M_dataplus)._M_p + 1)) {
            uVar6 = ::std::__cxx11::string::push_back(cVar10);
          }
          cVar11 = cVar11 + (uVar15 == 0x2e);
          iVar14 = iVar14 + pVar4.second;
          if (0xef < iVar14) {
            pcVar7 = (char *)CONCAT71((int7)(uVar6 >> 8),uVar15 == 0x2e);
            if ((local_60 & 1) == 0) {
              iVar2 = (int)element_local._M_len;
              iVar13 = (int)__pos;
              if ((int)__pos < iVar2 + -10) {
                iVar13 = iVar2 + -10;
              }
              lVar8 = (long)iVar2 - ((ulong)pVar4 >> 0x20);
              lVar9 = (long)iVar2 + -1;
              do {
                if (lVar9 <= iVar13) goto LAB_003183af;
                lVar1 = lVar9 + -1;
                lVar8 = lVar8 + -1;
                pcVar7 = element_local._M_str + lVar9;
                lVar9 = lVar1;
              } while (*pcVar7 != '.');
              if (lVar1 == -2) break;
              __pos = (string *)(long)(int)lVar8;
              pcVar7 = element_local._M_str;
            }
            local_60 = CONCAT71((int7)((ulong)pcVar7 >> 8),1);
          }
        }
      }
      path = (string *)element_local._M_len;
    }
LAB_003183af:
    if (iVar14 < 3 && iVar14 == cVar11) {
      ::std::__cxx11::string::erase
                (this,((*(long *)this + *(long *)(this + 8)) - (long)iVar14) + lVar3);
    }
    else if (*(long *)(this + 8) == 0) {
      ::std::__cxx11::string::assign((char *)this);
    }
  }
  return;
}

Assistant:

void sanitize_append_path_element(std::string& path, string_view element)
	{
		if (element.size() == 1 && element[0] == '.') return;

#ifdef TORRENT_WINDOWS
#define TORRENT_SEPARATOR '\\'
#else
#define TORRENT_SEPARATOR '/'
#endif
		path.reserve(path.size() + element.size() + 2);
		int added_separator = 0;
		if (!path.empty())
		{
			path += TORRENT_SEPARATOR;
			added_separator = 1;
		}

		if (element.empty())
		{
			path += "_";
			return;
		}

#if !TORRENT_USE_UNC_PATHS && defined TORRENT_WINDOWS
#pragma message ("building for windows without UNC paths is deprecated")

		// if we're not using UNC paths on windows, there
		// are certain filenames we're not allowed to use
		static const char const* reserved_names[] =
		{
			"con", "prn", "aux", "clock$", "nul",
			"com0", "com1", "com2", "com3", "com4",
			"com5", "com6", "com7", "com8", "com9",
			"lpt0", "lpt1", "lpt2", "lpt3", "lpt4",
			"lpt5", "lpt6", "lpt7", "lpt8", "lpt9"
		};
		int num_names = sizeof(reserved_names)/sizeof(reserved_names[0]);

		// this is not very efficient, but it only affects some specific
		// windows builds for now anyway (not even the default windows build)
		std::string pe(element);
		char const* file_end = strrchr(pe.c_str(), '.');
		std::string name = file_end
			? std::string(pe.data(), file_end)
			: pe;
		std::transform(name.begin(), name.end(), name.begin(), &to_lower);
		char const** str = std::find(reserved_names, reserved_names + num_names, name);
		if (str != reserved_names + num_names)
		{
			pe = "_" + pe;
			element = string_view();
		}
#endif
#ifdef TORRENT_WINDOWS
		// this counts the number of unicode characters
		// we've added (which is different from the number
		// of bytes)
		int unicode_chars = 0;
#endif

		int added = 0;
		// the number of dots we've added
		char num_dots = 0;
		bool found_extension = false;

		int seq_len = 0;
		for (std::size_t i = 0; i < element.size(); i += std::size_t(seq_len))
		{
			std::int32_t code_point;
			std::tie(code_point, seq_len) = parse_utf8_codepoint(element.substr(i));

			if (code_point >= 0 && filter_path_character(code_point))
			{
				continue;
			}

			if (code_point < 0 || !valid_path_character(code_point))
			{
				// invalid utf8 sequence, replace with "_"
				path += '_';
				++added;
#ifdef TORRENT_WINDOWS
				++unicode_chars;
#endif
				continue;
			}

			// validation passed, add it to the output string
			for (std::size_t k = i; k < i + std::size_t(seq_len); ++k)
			{
				TORRENT_ASSERT(element[k] != 0);
				path.push_back(element[k]);
			}

			if (code_point == '.') ++num_dots;

			added += seq_len;
#ifdef TORRENT_WINDOWS
			++unicode_chars;
#endif

			// any given path element should not
			// be more than 255 characters
			// if we exceed 240, pick up any potential
			// file extension and add that too
#ifdef TORRENT_WINDOWS
			if (unicode_chars >= 240 && !found_extension)
#else
			if (added >= 240 && !found_extension)
#endif
			{
				int dot = -1;
				for (int j = int(element.size()) - 1;
					j > std::max(int(element.size()) - 10, int(i)); --j)
				{
					if (element[aux::numeric_cast<std::size_t>(j)] != '.') continue;
					dot = j;
					break;
				}
				// there is no extension
				if (dot == -1) break;
				found_extension = true;
				TORRENT_ASSERT(dot > 0);
				i = std::size_t(dot - seq_len);
			}
		}

		if (added == num_dots && added <= 2)
		{
			// revert everything
			path.erase(path.end() - added - added_separator, path.end());
			return;
		}

#ifdef TORRENT_WINDOWS
		// remove trailing spaces and dots. These aren't allowed in filenames on windows
		for (int i = int(path.size()) - 1; i >= 0; --i)
		{
			if (path[i] != ' ' && path[i] != '.') break;
			path.resize(i);
			--added;
			TORRENT_ASSERT(added >= 0);
		}

		if (added == 0 && added_separator)
		{
			// remove the separator added at the beginning
			path.erase(path.end() - 1);
			return;
		}
#endif

		if (path.empty()) path = "_";
	}